

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIConfigureLog.cxx
# Opt level: O0

Value * cmFileAPIConfigureLogDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined1 local_30 [8];
  ConfigureLog configureLog;
  unsigned_long version_local;
  cmFileAPI *fileAPI_local;
  
  configureLog.Version = version;
  anon_unknown.dwarf_14f2143::ConfigureLog::ConfigureLog((ConfigureLog *)local_30,fileAPI,version);
  anon_unknown.dwarf_14f2143::ConfigureLog::Dump(__return_storage_ptr__,(ConfigureLog *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPIConfigureLogDump(cmFileAPI& fileAPI,
                                      unsigned long version)
{
  ConfigureLog configureLog(fileAPI, version);
  return configureLog.Dump();
}